

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_dist_to_tri(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *distance)

{
  double dVar1;
  double dVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  REF_DBL edge_dist2;
  REF_DBL edge_dist1;
  REF_DBL edge_dist0;
  undefined8 local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined8 uStack_30;
  
  uVar4 = ref_node_tri_projection(ref_node,nodes,xyz,&local_40);
  if (uVar4 == 0) {
    local_38 = local_40;
    uStack_30 = 0;
    local_60 = *(undefined8 *)(nodes + 1);
    uVar4 = ref_node_dist_to_edge(ref_node,(REF_INT *)&local_60,xyz,&local_48);
    if (uVar4 == 0) {
      local_60 = CONCAT44(*nodes,nodes[2]);
      uVar4 = ref_node_dist_to_edge(ref_node,(REF_INT *)&local_60,xyz,&local_50);
      if (uVar4 == 0) {
        local_60 = *(undefined8 *)nodes;
        uVar4 = ref_node_dist_to_edge(ref_node,(REF_INT *)&local_60,xyz,&local_58);
        if (uVar4 == 0) {
          if (local_38 <= -local_38) {
            local_38 = -local_38;
          }
          pRVar3 = ref_node->real;
          lVar5 = (long)*nodes;
          dVar10 = xyz[1];
          dVar1 = *xyz;
          dVar2 = xyz[2];
          dVar11 = (dVar2 - pRVar3[lVar5 * 0xf + 2]) * (dVar2 - pRVar3[lVar5 * 0xf + 2]) +
                   (dVar10 - pRVar3[lVar5 * 0xf + 1]) * (dVar10 - pRVar3[lVar5 * 0xf + 1]) +
                   (dVar1 - pRVar3[lVar5 * 0xf]) * (dVar1 - pRVar3[lVar5 * 0xf]);
          lVar5 = (long)nodes[1];
          lVar6 = (long)nodes[2];
          if (local_48 <= local_38) {
            local_38 = local_48;
          }
          dVar9 = (dVar2 - pRVar3[lVar5 * 0xf + 2]) * (dVar2 - pRVar3[lVar5 * 0xf + 2]) +
                  (dVar1 - pRVar3[lVar5 * 0xf]) * (dVar1 - pRVar3[lVar5 * 0xf]) +
                  (dVar10 - pRVar3[lVar5 * 0xf + 1]) * (dVar10 - pRVar3[lVar5 * 0xf + 1]);
          dVar10 = (dVar2 - pRVar3[lVar6 * 0xf + 2]) * (dVar2 - pRVar3[lVar6 * 0xf + 2]) +
                   (dVar1 - pRVar3[lVar6 * 0xf]) * (dVar1 - pRVar3[lVar6 * 0xf]) +
                   (dVar10 - pRVar3[lVar6 * 0xf + 1]) * (dVar10 - pRVar3[lVar6 * 0xf + 1]);
          if (local_58 <= local_50) {
            local_50 = local_58;
          }
          if (local_50 <= local_38) {
            local_38 = local_50;
          }
          if (dVar10 <= dVar9) {
            dVar9 = dVar10;
          }
          if (dVar9 <= dVar11) {
            dVar11 = dVar9;
          }
          if (dVar11 <= local_38) {
            local_38 = dVar11;
          }
          *distance = local_38;
          return 0;
        }
        pcVar8 = "e2";
        uVar7 = 0xc4f;
      }
      else {
        pcVar8 = "e1";
        uVar7 = 0xc4c;
      }
    }
    else {
      pcVar8 = "e0";
      uVar7 = 0xc49;
    }
  }
  else {
    pcVar8 = "proj";
    uVar7 = 0xc45;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar7,
         "ref_node_dist_to_tri",(ulong)uVar4,pcVar8);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_node_dist_to_tri(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *xyz, REF_DBL *distance) {
  REF_DBL projection;
  REF_DBL edge_dist0, edge_dist1, edge_dist2;
  REF_DBL node_dist0, node_dist1, node_dist2;
  REF_INT edge_nodes[2];
  RSS(ref_node_tri_projection(ref_node, nodes, xyz, &projection), "proj");
  projection = ABS(projection);
  edge_nodes[0] = nodes[1];
  edge_nodes[1] = nodes[2];
  RSS(ref_node_dist_to_edge(ref_node, edge_nodes, xyz, &edge_dist0), "e0");
  edge_nodes[0] = nodes[2];
  edge_nodes[1] = nodes[0];
  RSS(ref_node_dist_to_edge(ref_node, edge_nodes, xyz, &edge_dist1), "e1");
  edge_nodes[0] = nodes[0];
  edge_nodes[1] = nodes[1];
  RSS(ref_node_dist_to_edge(ref_node, edge_nodes, xyz, &edge_dist2), "e2");
  node_dist0 = pow(xyz[0] - ref_node_xyz(ref_node, 0, nodes[0]), 2) +
               pow(xyz[1] - ref_node_xyz(ref_node, 1, nodes[0]), 2) +
               pow(xyz[2] - ref_node_xyz(ref_node, 2, nodes[0]), 2);
  node_dist1 = pow(xyz[0] - ref_node_xyz(ref_node, 0, nodes[1]), 2) +
               pow(xyz[1] - ref_node_xyz(ref_node, 1, nodes[1]), 2) +
               pow(xyz[2] - ref_node_xyz(ref_node, 2, nodes[1]), 2);
  node_dist2 = pow(xyz[0] - ref_node_xyz(ref_node, 0, nodes[2]), 2) +
               pow(xyz[1] - ref_node_xyz(ref_node, 1, nodes[2]), 2) +
               pow(xyz[2] - ref_node_xyz(ref_node, 2, nodes[2]), 2);
  *distance = MIN(MIN(MIN(projection, edge_dist0), MIN(edge_dist1, edge_dist2)),
                  MIN(node_dist0, MIN(node_dist1, node_dist2)));

  return REF_SUCCESS;
}